

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O3

Sto_Man_t * Sto_ManAlloc(void)

{
  Sto_Man_t *pSVar1;
  
  pSVar1 = (Sto_Man_t *)calloc(1,0x38);
  pSVar1->nChunkSize = 0x10000;
  return pSVar1;
}

Assistant:

Sto_Man_t * Sto_ManAlloc()
{
    Sto_Man_t * p;
    // allocate the manager
    p = (Sto_Man_t *)ABC_ALLOC( char, sizeof(Sto_Man_t) );
    memset( p, 0, sizeof(Sto_Man_t) );
    // memory management
    p->nChunkSize = (1<<16); // use 64K chunks
    return p;    
}